

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O3

int glucose_solver_addclause(SimpSolver *S,int *plits,int nlits)

{
  vec<Gluco::Lit> *copy;
  bool bVar1;
  int iVar2;
  Lit p;
  Lit local_4c;
  vec<Gluco::Lit> local_48;
  
  local_48.data = (Lit *)0x0;
  local_48.sz = 0;
  local_48.cap = 0;
  if (0 < nlits) {
    iVar2 = 0;
    do {
      while ((S->super_Solver).vardata.sz <= *plits / 2) {
        Gluco::SimpSolver::newVar(S,true,true);
      }
      local_4c.x = *plits;
      Gluco::vec<Gluco::Lit>::push(&local_48,&local_4c);
      iVar2 = iVar2 + 1;
      plits = plits + 1;
    } while (iVar2 != nlits);
  }
  copy = &(S->super_Solver).add_tmp;
  Gluco::vec<Gluco::Lit>::copyTo(&local_48,copy);
  bVar1 = Gluco::SimpSolver::addClause_(S,copy);
  if (local_48.data != (Lit *)0x0) {
    local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
    free(local_48.data);
  }
  return (int)bVar1;
}

Assistant:

int glucose_solver_addclause(Gluco::SimpSolver* S, int * plits, int nlits)
{
    vec<Lit> lits;
    for ( int i = 0; i < nlits; i++,plits++)
    {
        // note: Glucose uses the same var->lit conventiaon as ABC
        while ((*plits)/2 >= S->nVars()) S->newVar();
        assert((*plits)/2 < S->nVars()); // NOTE: since we explicitely use new function bmc_add_var
        Lit p;
        p.x = *plits;
        lits.push(p);
    }
    return S->addClause(lits); // returns 0 if the problem is UNSAT
}